

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

times * __thiscall
lest::for_test<lest::times>(lest *this,tests *specification,texts *in,times *perform,int n)

{
  bool bVar1;
  uint uVar2;
  times *perform_00;
  fd_set *__exceptfds;
  fd_set *__writefds;
  undefined4 in_register_00000084;
  test local_d8;
  undefined1 local_88 [56];
  reference local_50;
  test *testing;
  iterator __end3;
  iterator __begin3;
  tests *__range3;
  int i;
  int n_local;
  times *perform_local;
  texts *in_local;
  tests *specification_local;
  
  __range3._0_4_ = 0;
  do {
    uVar2 = indefinite((int)perform);
    __exceptfds = (fd_set *)(ulong)uVar2;
    if (uVar2 == 0 && (int)perform <= (int)__range3) {
      return (times *)in;
    }
    __end3 = std::vector<lest::test,_std::allocator<lest::test>_>::begin
                       ((vector<lest::test,_std::allocator<lest::test>_> *)this);
    testing = (test *)std::vector<lest::test,_std::allocator<lest::test>_>::end
                                ((vector<lest::test,_std::allocator<lest::test>_> *)this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>
                                       *)&testing), bVar1) {
      local_50 = __gnu_cxx::
                 __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>
                 ::operator*(&__end3);
      std::__cxx11::string::string((string *)(local_88 + 0x18),(string *)local_50);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_88,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)specification);
      uVar2 = select((int)local_88 + 0x18,(fd_set *)local_88,__writefds,__exceptfds,
                     (timeval *)CONCAT44(in_register_00000084,n));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_88);
      std::__cxx11::string::~string((string *)(local_88 + 0x18));
      if ((uVar2 & 1) != 0) {
        test::test(&local_d8,local_50);
        perform_00 = times::operator()((times *)in,&local_d8);
        bVar1 = abort<lest::times>(perform_00);
        test::~test(&local_d8);
        if (bVar1) {
          return (times *)in;
        }
      }
      __gnu_cxx::
      __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>::
      operator++(&__end3);
    }
    __range3._0_4_ = (int)__range3 + 1;
  } while( true );
}

Assistant:

Action && for_test( tests specification, texts in, Action && perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( auto & testing : specification )
        {
            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return std::move( perform );
        }
    }
    return std::move( perform );
}